

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.h
# Opt level: O1

CharPtr __thiscall
fmt::BasicWriter<wchar_t>::write_str<wchar_t>
          (BasicWriter<wchar_t> *this,wchar_t *s,size_t size,AlignSpec *spec)

{
  wchar_t wVar1;
  undefined8 *puVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  ulong uVar6;
  long lVar7;
  size_t size_1;
  CharPtr __dest;
  
  uVar4 = (ulong)(spec->super_WidthSpec).width_;
  puVar2 = *(undefined8 **)(this + 8);
  lVar5 = puVar2[2];
  if (size < uVar4) {
    uVar4 = uVar4 + lVar5;
    if ((ulong)puVar2[3] < uVar4) {
      (**(code **)*puVar2)(puVar2,uVar4);
    }
    puVar2[2] = uVar4;
    lVar3 = *(long *)(*(long *)(this + 8) + 8);
    __dest = (CharPtr)(lVar3 + lVar5 * 4);
    uVar4 = (ulong)(spec->super_WidthSpec).width_;
    wVar1 = (spec->super_WidthSpec).fill_;
    if (spec->align_ == ALIGN_CENTER) {
      uVar6 = uVar4 - size >> 1;
      if (1 < uVar4 - size) {
        lVar7 = 0;
        do {
          *(wchar_t *)((long)__dest + lVar7) = wVar1;
          lVar7 = lVar7 + 4;
        } while (uVar6 * 4 - lVar7 != 0);
      }
      __dest = __dest + uVar6;
      if (uVar4 != size) {
        lVar7 = uVar6 << 2;
        do {
          *(wchar_t *)(lVar3 + size * 4 + lVar5 * 4 + lVar7) = wVar1;
          lVar7 = lVar7 + 4;
        } while (uVar4 * 4 + size * -4 != lVar7);
      }
    }
    else if (spec->align_ == ALIGN_RIGHT) {
      if (uVar4 - size != 0) {
        lVar5 = 0;
        do {
          *(wchar_t *)((long)__dest + lVar5) = wVar1;
          lVar5 = lVar5 + 4;
        } while (uVar4 * 4 + size * -4 != lVar5);
      }
      __dest = __dest + (uVar4 - size);
    }
    else if (uVar4 != size) {
      lVar5 = size * 4;
      do {
        *(wchar_t *)((long)__dest + lVar5) = wVar1;
        lVar5 = lVar5 + 4;
      } while (uVar4 << 2 != lVar5);
    }
  }
  else {
    uVar4 = lVar5 + size;
    if ((ulong)puVar2[3] < uVar4) {
      (**(code **)*puVar2)(puVar2,uVar4);
    }
    puVar2[2] = uVar4;
    __dest = (CharPtr)(lVar5 * 4 + *(long *)(*(long *)(this + 8) + 8));
  }
  if (size != 0) {
    memmove(__dest,s,size << 2);
  }
  return __dest;
}

Assistant:

typename BasicWriter<Char>::CharPtr BasicWriter<Char>::write_str(
      const StrChar *s, std::size_t size, const AlignSpec &spec) {
  CharPtr out = CharPtr();
  if (spec.width() > size) {
    out = grow_buffer(spec.width());
    Char fill = internal::CharTraits<Char>::cast(spec.fill());
    if (spec.align() == ALIGN_RIGHT) {
      std::fill_n(out, spec.width() - size, fill);
      out += spec.width() - size;
    } else if (spec.align() == ALIGN_CENTER) {
      out = fill_padding(out, spec.width(), size, fill);
    } else {
      std::fill_n(out + size, spec.width() - size, fill);
    }
  } else {
    out = grow_buffer(size);
  }
  std::copy(s, s + size, out);
  return out;
}